

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustring.cpp
# Opt level: O0

int32_t u_unescape_63(char *src,UChar *dest,int32_t destCapacity)

{
  uint uVar1;
  size_t sVar2;
  int iVar3;
  int32_t local_3c;
  UChar32 c32;
  int32_t lenParsed;
  char c;
  UChar *pUStack_30;
  int32_t i;
  char *segment;
  UChar *pUStack_20;
  int32_t destCapacity_local;
  UChar *dest_local;
  char *src_local;
  
  lenParsed = 0;
  pUStack_30 = (UChar *)src;
  segment._4_4_ = destCapacity;
  pUStack_20 = dest;
  dest_local = (UChar *)src;
  do {
    while( true ) {
      while( true ) {
        c32._3_1_ = (char)*dest_local;
        if (c32._3_1_ == '\0') {
          if (dest_local != pUStack_30) {
            if (pUStack_20 != (UChar *)0x0) {
              _appendUChars(pUStack_20 + lenParsed,segment._4_4_ - lenParsed,(char *)pUStack_30,
                            (int)dest_local - (int)pUStack_30);
            }
            lenParsed = ((int)dest_local - (int)pUStack_30) + lenParsed;
          }
          if ((pUStack_20 != (UChar *)0x0) && (lenParsed < segment._4_4_)) {
            pUStack_20[lenParsed] = L'\0';
          }
          return lenParsed;
        }
        if (c32._3_1_ == '\\') break;
        dest_local = (UChar *)((long)dest_local + 1);
      }
      local_3c = 0;
      if (dest_local != pUStack_30) {
        if (pUStack_20 != (UChar *)0x0) {
          _appendUChars(pUStack_20 + lenParsed,segment._4_4_ - lenParsed,(char *)pUStack_30,
                        (int)dest_local - (int)pUStack_30);
        }
        lenParsed = ((int)dest_local - (int)pUStack_30) + lenParsed;
      }
      dest_local = (UChar *)((long)dest_local + 1);
      sVar2 = strlen((char *)dest_local);
      uVar1 = u_unescapeAt_63(_charPtr_charAt,&local_3c,(int32_t)sVar2,dest_local);
      if (local_3c == 0) {
        if ((pUStack_20 != (UChar *)0x0) && (0 < segment._4_4_)) {
          *pUStack_20 = L'\0';
        }
        return 0;
      }
      pUStack_30 = (UChar *)((long)dest_local + (long)local_3c);
      dest_local = pUStack_30;
      if (pUStack_20 != (UChar *)0x0) break;
LAB_004a029f:
      iVar3 = 2;
      if (uVar1 < 0x10000) {
        iVar3 = 1;
      }
      lenParsed = iVar3 + lenParsed;
    }
    iVar3 = 2;
    if (uVar1 < 0x10000) {
      iVar3 = 1;
    }
    if (segment._4_4_ - lenParsed < iVar3) goto LAB_004a029f;
    if (uVar1 < 0x10000) {
      pUStack_20[lenParsed] = (UChar)uVar1;
      lenParsed = lenParsed + 1;
    }
    else {
      iVar3 = lenParsed + 1;
      pUStack_20[lenParsed] = (short)((int)uVar1 >> 10) + L'ퟀ';
      lenParsed = lenParsed + 2;
      pUStack_20[iVar3] = (UChar)uVar1 & 0x3ffU | 0xdc00;
    }
  } while( true );
}

Assistant:

U_CAPI int32_t U_EXPORT2
u_unescape(const char *src, UChar *dest, int32_t destCapacity) {
    const char *segment = src;
    int32_t i = 0;
    char c;

    while ((c=*src) != 0) {
        /* '\\' intentionally written as compiler-specific
         * character constant to correspond to compiler-specific
         * char* constants. */
        if (c == '\\') {
            int32_t lenParsed = 0;
            UChar32 c32;
            if (src != segment) {
                if (dest != NULL) {
                    _appendUChars(dest + i, destCapacity - i,
                                  segment, (int32_t)(src - segment));
                }
                i += (int32_t)(src - segment);
            }
            ++src; /* advance past '\\' */
            c32 = (UChar32)u_unescapeAt(_charPtr_charAt, &lenParsed, (int32_t)uprv_strlen(src), (void*)src);
            if (lenParsed == 0) {
                goto err;
            }
            src += lenParsed; /* advance past escape seq. */
            if (dest != NULL && U16_LENGTH(c32) <= (destCapacity - i)) {
                U16_APPEND_UNSAFE(dest, i, c32);
            } else {
                i += U16_LENGTH(c32);
            }
            segment = src;
        } else {
            ++src;
        }
    }
    if (src != segment) {
        if (dest != NULL) {
            _appendUChars(dest + i, destCapacity - i,
                          segment, (int32_t)(src - segment));
        }
        i += (int32_t)(src - segment);
    }
    if (dest != NULL && i < destCapacity) {
        dest[i] = 0;
    }
    return i;

 err:
    if (dest != NULL && destCapacity > 0) {
        *dest = 0;
    }
    return 0;
}